

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultvalue.cpp
# Opt level: O2

ostream * operator<<(ostream *os,ResultValue value)

{
  string sign;
  allocator local_59;
  double local_58;
  undefined8 uStack_50;
  double local_40;
  string local_38 [32];
  double local_18;
  undefined8 uStack_10;
  
  switch(value.mType) {
  case NONE:
    std::operator<<(os,"NONE");
    break;
  case FLOAT:
    value.mComplexValue._M_value._0_8_ = value.mFloatValue;
    goto LAB_00130451;
  case INTEGER:
    std::ostream::_M_insert<long>((long)os);
    break;
  case COMPLEX:
    local_18 = ABS((double)value.mComplexValue._M_value._8_8_);
    uStack_10 = 0;
    if (1e-10 < local_18) {
      local_40 = (double)value.mComplexValue._M_value._0_8_;
      local_58 = (double)value.mComplexValue._M_value._8_8_;
      uStack_50 = 0;
      std::__cxx11::string::string(local_38,"+",&local_59);
      if (local_58 < 0.0) {
        std::__cxx11::string::assign((char *)local_38);
      }
      if ((local_40 != 0.0) || (NAN(local_40))) {
        std::ostream::_M_insert<double>(local_40);
      }
      else {
        std::__cxx11::string::assign((char *)local_38);
      }
      std::operator<<(os,local_38);
      if ((local_18 != 1.0) || (NAN(local_18))) {
        std::ostream::_M_insert<double>(local_58);
      }
      if ((local_58 == -1.0) && (!NAN(local_58))) {
        std::operator<<(os,"-");
      }
      std::operator<<(os,"i");
      std::__cxx11::string::~string(local_38);
      return os;
    }
LAB_00130451:
    std::ostream::_M_insert<double>((double)value.mComplexValue._M_value._0_8_);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ResultValue value) {
	switch (value.type()) {
		case ResultValueType::NONE:
			os << "NONE";
			break;
		case ResultValueType::FLOAT:
			os << value.floatValue();
			break;
		case ResultValueType::INTEGER:
			os << value.intValue();
			break;
		case ResultValueType::COMPLEX:
			if (std::abs(value.complexValue().imag()) <= EPSILON) {
				os << value.complexValue().real();
			} else {
				std::string sign = "+";
				if (value.complexValue().imag() < 0) {
					sign = "";
				}

				if (value.complexValue().real() != 0) {
					os << value.complexValue().real();
				} else {
					sign = "";
				}

				os << sign;

				if (std::abs(value.complexValue().imag()) != 1) {
					os << value.complexValue().imag();
				}

				if (value.complexValue().imag() == -1) {
					os << "-";
				}

				os << "i";
			}
			break;
	}

	return os;
}